

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<float> fmt::v11::detail::dragonbox::to_decimal<float>(float x)

{
  uint uVar1;
  undefined1 auVar2 [16];
  compute_mul_parity_result cVar3;
  ulong uVar4;
  decimal_fp<float> dVar5;
  significand_type sVar6;
  int iVar7;
  int iVar8;
  decimal_fp<float> dVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  decimal_fp<float> dVar17;
  cache_entry_type cache;
  ulong local_40;
  ulong local_38;
  
  uVar14 = (uint)x & 0x7fffff;
  uVar11 = (uint)x >> 0x17 & 0xff;
  if (uVar11 == 0) {
    iVar12 = -0x95;
    if (uVar14 == 0) {
      dVar5.significand = 0;
      dVar5.exponent = 0;
      uVar13 = 0;
      goto LAB_001dd7fe;
    }
  }
  else {
    iVar12 = uVar11 - 0x96;
    if (uVar14 == 0) {
      dVar5 = shorter_interval_case<float>(iVar12);
      uVar13 = (ulong)dVar5 >> 0x20;
      goto LAB_001dd7fe;
    }
    uVar14 = uVar14 | 0x800000;
  }
  uVar11 = iVar12 * 0x4d105 >> 0x14;
  uVar13 = (ulong)uVar11;
  if (0x4d < 0x20 - uVar11) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x115,"k is out of range");
  }
  local_40 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                       (ulong)(0x20 - uVar11) * 8);
  iVar12 = ((int)((1 - uVar11) * 0x1a934f) >> 0x13) + iVar12;
  uVar10 = local_40 >> (~(byte)iVar12 & 0x3f);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_40;
  auVar2 = auVar2 * (ZEXT416(uVar14 * 2 + 1 << ((byte)iVar12 & 0x1f)) << 0x20);
  uVar4 = auVar2._8_8_ >> 0x20;
  dVar9 = (decimal_fp<float>)(uVar4 / 100);
  iVar8 = (int)(uVar4 / 100);
  iVar7 = (int)(uVar4 / 100);
  uVar16 = iVar7 * -100 + auVar2._12_4_;
  if (uVar16 < (uint)uVar10) {
    if ((uVar16 != 0) || ((auVar2._8_4_ != 0 || ((uVar14 & 1) == 0)))) {
LAB_001dd730:
      if (auVar2._12_4_ >> 2 < 0x19) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x482,"");
      }
      uVar14 = 0;
      while( true ) {
        sVar6 = dVar9.significand;
        uVar16 = sVar6 * 0x40000000 | sVar6 * -0x3d70a3d7 >> 2;
        if (0x28f5c28 < uVar16) break;
        dVar9.exponent = 0;
        dVar9.significand = uVar16;
        uVar14 = uVar14 + 2;
      }
      dVar17.significand = sVar6 * -0x33333333 >> 1 | (uint)((sVar6 * -0x33333333 & 1) != 0) << 0x1f
      ;
      dVar17.exponent = 0;
      dVar5 = dVar17;
      if (dVar17.significand >= 0x1999999a) {
        dVar5 = dVar9;
      }
      uVar13 = (ulong)(uVar11 + 1 + (uVar14 | dVar17.significand < 0x1999999a));
      goto LAB_001dd7fe;
    }
    iVar8 = iVar7 + -1;
    uVar16 = 100;
  }
  else if ((uVar16 <= (uint)uVar10) &&
          (local_38 = uVar10,
          cVar3 = cache_accessor<float>::compute_mul_parity(uVar14 * 2 - 1,&local_40,iVar12),
          uVar10 = local_38,
          (~uVar14 & (uint)((ushort)cVar3 >> 8) & 1) != 0 || ((ushort)cVar3 & 1) != 0))
  goto LAB_001dd730;
  uVar16 = uVar16 - ((uint)(uVar10 >> 1) & 0x7fffffff);
  uVar11 = uVar16 + 5;
  if (100 < uVar11) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xed,"n is too large");
  }
  uVar11 = uVar11 * 0x199a;
  uVar15 = uVar11 >> 0x10;
  uVar1 = uVar15 + iVar8 * 10;
  dVar5.exponent = 0;
  dVar5.significand = uVar1;
  if ((uVar11 & 0xffff) < 0x199a) {
    cVar3 = cache_accessor<float>::compute_mul_parity(uVar14 * 2,&local_40,iVar12);
    if ((uVar16 & 1) == ((ushort)cVar3 & 1)) {
      dVar5.significand = uVar1 - (uVar15 & (ushort)cVar3 >> 8 & 1);
      dVar5.exponent = 0;
    }
    else {
      dVar5.significand = uVar1 - 1;
      dVar5.exponent = 0;
    }
  }
LAB_001dd7fe:
  return (decimal_fp<float>)((ulong)dVar5 & 0xffffffff | uVar13 << 0x20);
}

Assistant:

auto small_division_by_pow10(uint32_t n) noexcept -> uint32_t {
  constexpr auto info = div_small_pow10_infos[N - 1];
  FMT_ASSERT(n <= info.divisor * 10, "n is too large");
  constexpr uint32_t magic_number =
      (1u << info.shift_amount) / info.divisor + 1;
  return (n * magic_number) >> info.shift_amount;
}